

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_mlal(DisasContext_conflict1 *s,arg_s_rrrr *a,_Bool uns,_Bool add)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar2;
  undefined1 extraout_AL;
  TCGTemp *a2;
  TCGTemp *pTVar3;
  undefined7 in_register_00000011;
  uintptr_t o_3;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 var_00;
  uintptr_t o_1;
  TCGv_i32 var_01;
  TCGv_i32 var_02;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rm;
  a2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var_02 = (TCGv_i32)((long)a2 - (long)s_00);
  load_reg_var(s,var_02,iVar1);
  iVar1 = a->rn;
  pTVar2 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  load_reg_var(s,var,iVar1);
  if ((int)CONCAT71(in_register_00000011,uns) == 0) {
    tcg_gen_muls2_i32_aarch64(s_00,var_02,var,var_02,var);
  }
  else {
    tcg_gen_mulu2_i32_aarch64(s_00,var_02,var,var_02,var);
  }
  if (add) {
    iVar1 = a->ra;
    pTVar2 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    var_00 = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
    load_reg_var(s,var_00,iVar1);
    iVar1 = a->rd;
    pTVar2 = s->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
    var_01 = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
    load_reg_var(s,var_01,iVar1);
    tcg_gen_add2_i32_aarch64(s_00,var_02,var,var_02,var,var_00,var_01);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_00 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_01 + (long)s_00));
  }
  if (a->s != 0) {
    if (s_00->cpu_NF != var) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),
                          (TCGArg)((long)s_00 + (long)var));
    }
    tcg_gen_op3_aarch64(s_00,INDEX_op_or_i32,(TCGArg)(s_00->cpu_ZF + (long)s_00),(TCGArg)a2,
                        (TCGArg)((long)s_00 + (long)var));
  }
  store_reg(s,a->ra,var_02);
  store_reg(s,a->rd,var);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_mlal(DisasContext *s, arg_s_rrrr *a, bool uns, bool add)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, t2, t3;

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    if (uns) {
        tcg_gen_mulu2_i32(tcg_ctx, t0, t1, t0, t1);
    } else {
        tcg_gen_muls2_i32(tcg_ctx, t0, t1, t0, t1);
    }
    if (add) {
        t2 = load_reg(s, a->ra);
        t3 = load_reg(s, a->rd);
        tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    if (a->s) {
        gen_logicq_cc(tcg_ctx, t0, t1);
    }
    store_reg(s, a->ra, t0);
    store_reg(s, a->rd, t1);
    return true;
}